

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_173::FunctionOptimizer::makeExpression<wasm::StructGet>
          (FunctionOptimizer *this,PossibleConstantValues *info,HeapType type,StructGet *curr)

{
  Type left;
  undefined8 value_00;
  bool bVar1;
  Module *pMVar2;
  Field *pFVar3;
  Drop *left_00;
  Expression *right;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_78;
  Builder local_68;
  Builder builder;
  undefined1 local_48 [8];
  optional<wasm::Field> field;
  Expression *value;
  StructGet *curr_local;
  PossibleConstantValues *info_local;
  FunctionOptimizer *this_local;
  HeapType type_local;
  
  pMVar2 = Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                        ).
                        super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                      );
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ =
       PossibleConstantValues::makeExpression(info,pMVar2);
  GCTypeUtils::getField((optional<wasm::Field> *)local_48,type,curr->index);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_48);
  value_00 = field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Field>._16_8_;
  if (!bVar1) {
    __assert_fail("field",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/ConstantFieldPropagation.cpp"
                  ,0x8f,
                  "Expression *wasm::(anonymous namespace)::FunctionOptimizer::makeExpression(const PossibleConstantValues &, HeapType, T *) [T = wasm::StructGet]"
                 );
  }
  pFVar3 = std::optional<wasm::Field>::operator*((optional<wasm::Field> *)local_48);
  bVar1 = curr->signed_;
  pMVar2 = Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
           ::getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                        ).
                        super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                        .
                        super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                      );
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._16_8_ =
       Bits::makePackedFieldGet((Expression *)value_00,pFVar3,(bool)(bVar1 & 1),pMVar2);
  left.id = (((Expression *)
             field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Field>._16_8_)->type).id;
  pFVar3 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_48);
  builder.wasm = (Module *)(pFVar3->type).id;
  bVar1 = wasm::Type::isSubType(left,(Type)builder.wasm);
  if (!bVar1) {
    pMVar2 = Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>
                        );
    Builder::Builder(&local_68,pMVar2);
    left_00 = Builder::makeDrop(&local_68,
                                (Expression *)
                                field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
                                super__Optional_payload_base<wasm::Field>._16_8_);
    right = (Expression *)Builder::makeUnreachable(&local_68);
    std::optional<wasm::Type>::optional(&local_78);
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_78.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_78.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Field>._16_8_ =
         Builder::makeSequence(&local_68,(Expression *)left_00,right,type_00);
  }
  return (Expression *)
         field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Field>._16_8_;
}

Assistant:

Expression*
  makeExpression(const PossibleConstantValues& info, HeapType type, T* curr) {
    auto* value = info.makeExpression(*getModule());
    auto field = GCTypeUtils::getField(type, curr->index);
    assert(field);
    // Apply packing, if needed.
    if constexpr (std::is_same_v<T, StructGet>) {
      value =
        Bits::makePackedFieldGet(value, *field, curr->signed_, *getModule());
    }
    // Check if the value makes sense. The analysis below flows values around
    // without considering where they are placed, that is, when we see a parent
    // type can contain a value in a field then we assume a child may as well
    // (which in general it can, e.g., using a reference to the parent, we can
    // write that value to it, but the reference might actually point to a
    // child instance). If we tracked the types of fields then we might avoid
    // flowing values into places they cannot reside, like when a child field is
    // a subtype, and so we could ignore things not refined enough for it (GUFA
    // does a better job at this). For here, just check we do not break
    // validation, and if we do, then we've inferred the only possible value is
    // an impossible one, making the code unreachable.
    if (!Type::isSubType(value->type, field->type)) {
      Builder builder(*getModule());
      value = builder.makeSequence(builder.makeDrop(value),
                                   builder.makeUnreachable());
    }
    return value;
  }